

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O2

void __thiscall net_uv::KCPServer::onSessionClose(KCPServer *this,Session *session)

{
  undefined4 in_EAX;
  iterator iVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  
  if (session != (Session *)0x0) {
    uVar2 = CONCAT44(session->m_sessionID,in_EAX);
    iVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>,_std::_Select1st<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
            ::find(&(this->m_allSession)._M_t,(key_type *)&stack0xffffffffffffffec);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header
       ) {
      *(undefined1 *)&iVar1._M_node[1]._M_left = 1;
      (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,6,session,0,0,in_R9,uVar2);
    }
  }
  return;
}

Assistant:

void KCPServer::onSessionClose(Session* session)
{
	if (session == NULL)
	{
		return;
	}
	auto it = m_allSession.find(session->getSessionID());
	if (it != m_allSession.end())
	{
		it->second.isInvalid = true;
		pushThreadMsg(NetThreadMsgType::DIS_CONNECT, session);
	}
}